

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrActionType value)

{
  XrActionType value_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *item_name_local;
  string *validation_name_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if (value == XR_ACTION_TYPE_BOOLEAN_INPUT) {
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_ACTION_TYPE_FLOAT_INPUT) {
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_ACTION_TYPE_VECTOR2F_INPUT) {
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_ACTION_TYPE_POSE_INPUT) {
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_ACTION_TYPE_VIBRATION_OUTPUT) {
    instance_info_local._7_1_ = true;
  }
  else {
    instance_info_local._7_1_ = false;
  }
  return instance_info_local._7_1_;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrActionType value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    switch (value) {
        case XR_ACTION_TYPE_BOOLEAN_INPUT:
            return true;
        case XR_ACTION_TYPE_FLOAT_INPUT:
            return true;
        case XR_ACTION_TYPE_VECTOR2F_INPUT:
            return true;
        case XR_ACTION_TYPE_POSE_INPUT:
            return true;
        case XR_ACTION_TYPE_VIBRATION_OUTPUT:
            return true;
    default:
        return false;
}
}